

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverIo.c
# Opt level: O0

void Msat_SolverPrintAssignment(Msat_Solver_t *p)

{
  int local_14;
  int i;
  Msat_Solver_t *p_local;
  
  printf("Current assignments are: \n");
  for (local_14 = 0; local_14 < p->nVars; local_14 = local_14 + 1) {
    printf("%d",(long)local_14 % 10 & 0xffffffff);
  }
  printf("\n");
  local_14 = 0;
  do {
    if (p->nVars <= local_14) {
      printf("\n");
      return;
    }
    if (p->pAssigns[local_14] == -1) {
      printf(".");
    }
    else {
      if (local_14 != p->pAssigns[local_14] >> 1) {
        __assert_fail("i == MSAT_LIT2VAR(p->pAssigns[i])",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatSolverIo.c"
                      ,0x3b,"void Msat_SolverPrintAssignment(Msat_Solver_t *)");
      }
      if ((p->pAssigns[local_14] & 1U) == 0) {
        printf("1");
      }
      else {
        printf("0");
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void Msat_SolverPrintAssignment( Msat_Solver_t * p )
{
    int i;
    printf( "Current assignments are: \n" );
    for ( i = 0; i < p->nVars; i++ )
        printf( "%d", i % 10 );
    printf( "\n" );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pAssigns[i] == MSAT_VAR_UNASSIGNED )
            printf( "." );
        else
        {
            assert( i == MSAT_LIT2VAR(p->pAssigns[i]) );
            if ( MSAT_LITSIGN(p->pAssigns[i]) )
                printf( "0" );
            else 
                printf( "1" );
        }
    printf( "\n" );
}